

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_1::AssertionPrinter::printRemainingMessages(AssertionPrinter *this,Code colour)

{
  pointer pMVar1;
  pointer pMVar2;
  ostream *os;
  long in_FS_OFFSET;
  Colour colourGuard;
  allocator local_81;
  string local_80 [32];
  Colour colourGuard_1;
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pMVar1 = (this->messages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pMVar2 = (this->itMessage)._M_current;
  if (pMVar2 != pMVar1) {
    colourGuard.m_moved = false;
    Colour::use(colour);
    os = std::operator<<(this->stream," with ");
    std::__cxx11::string::string(local_80,"message",&local_81);
    _colourGuard_1 = ((long)pMVar1 - (long)pMVar2) / 0x48;
    std::__cxx11::string::string(local_58,local_80);
    Catch::operator<<(os,(pluralise *)&colourGuard_1);
    std::operator<<(os,':');
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_80);
    Colour::~Colour(&colourGuard);
    while (pMVar2 = (this->itMessage)._M_current, pMVar2 != pMVar1) {
      if ((this->printInfoMessages == false) && (pMVar2->type == Info)) {
        (this->itMessage)._M_current = pMVar2 + 1;
      }
      else {
        printMessage(this);
        if ((this->itMessage)._M_current != pMVar1) {
          _colourGuard_1 = _colourGuard_1 & 0xffffffffffffff00;
          Colour::use(FileName);
          std::operator<<(this->stream," and");
          Colour::~Colour(&colourGuard_1);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void printRemainingMessages(Colour::Code colour = dimColour()) {
        if (itMessage == messages.end())
            return;

        const auto itEnd = messages.cend();
        const auto N = static_cast<std::size_t>(std::distance(itMessage, itEnd));

        {
            Colour colourGuard(colour);
            stream << " with " << pluralise(N, "message") << ':';
        }

        while (itMessage != itEnd) {
            // If this assertion is a warning ignore any INFO messages
            if (printInfoMessages || itMessage->type != ResultWas::Info) {
                printMessage();
                if (itMessage != itEnd) {
                    Colour colourGuard(dimColour());
                    stream << " and";
                }
                continue;
            }
            ++itMessage;
        }
    }